

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIvy.c
# Opt level: O2

Vec_Int_t * Abc_NtkCollectLatchValuesIvy(Abc_Ntk_t *pNtk,int fUseDcs)

{
  Vec_Int_t *p;
  int *piVar1;
  Abc_Obj_t *pAVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  
  iVar5 = pNtk->nObjCounts[8];
  p = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar3 = iVar5;
  }
  p->nSize = 0;
  p->nCap = iVar3;
  iVar5 = 0;
  if (iVar3 == 0) {
    piVar1 = (int *)0x0;
  }
  else {
    piVar1 = (int *)malloc((long)iVar3 << 2);
  }
  p->pArray = piVar1;
  do {
    if (pNtk->vBoxes->nSize <= iVar5) {
      return p;
    }
    pAVar2 = Abc_NtkBox(pNtk,iVar5);
    if ((*(uint *)&pAVar2->field_0x14 & 0xf) == 8) {
      iVar3 = 3;
      if (fUseDcs == 0) {
        uVar4 = (long)(pAVar2->field_5).pData - 1;
        if (2 < uVar4) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIvy.c"
                        ,0x473,"Vec_Int_t *Abc_NtkCollectLatchValuesIvy(Abc_Ntk_t *, int)");
        }
        iVar3 = (int)uVar4 + 1;
      }
      Vec_IntPush(p,iVar3);
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Abc_NtkCollectLatchValuesIvy( Abc_Ntk_t * pNtk, int fUseDcs )
{
    Abc_Obj_t * pLatch;
    Vec_Int_t * vArray;
    int i;
    vArray = Vec_IntAlloc( Abc_NtkLatchNum(pNtk) );
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
        if ( fUseDcs || Abc_LatchIsInitDc(pLatch) )
            Vec_IntPush( vArray, IVY_INIT_DC );
        else if ( Abc_LatchIsInit1(pLatch) )
            Vec_IntPush( vArray, IVY_INIT_1 );
        else if ( Abc_LatchIsInit0(pLatch) )
            Vec_IntPush( vArray, IVY_INIT_0 );
        else assert( 0 );
    }
    return vArray;
}